

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_ameth.c
# Opt level: O0

int rsa_priv_decode(EVP_PKEY *pkey,PKCS8_PRIV_KEY_INFO *p8)

{
  RSA *key;
  EVP_PKEY *in_RDI;
  OSSL_LIB_CTX *unaff_retaddr;
  RSA *rsa;
  int ret;
  uint local_14;
  
  key = ossl_rsa_key_from_pkcs8((PKCS8_PRIV_KEY_INFO *)rsa,unaff_retaddr,(char *)in_RDI);
  if (key != (RSA *)0x0) {
    EVP_PKEY_assign(in_RDI,**(int **)&in_RDI->references,key);
  }
  local_14 = (uint)(key != (RSA *)0x0);
  return local_14;
}

Assistant:

static int rsa_priv_decode(EVP_PKEY *pkey, const PKCS8_PRIV_KEY_INFO *p8)
{
    int ret = 0;
    RSA *rsa = ossl_rsa_key_from_pkcs8(p8, NULL, NULL);

    if (rsa != NULL) {
        ret = 1;
        EVP_PKEY_assign(pkey, pkey->ameth->pkey_id, rsa);
    }
    return ret;
}